

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmbInternal.cpp
# Opt level: O3

void chatra::emb::writeRawInt
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *buffer,int64_t value)

{
  pointer *ppuVar1;
  bool bVar2;
  ulong uVar3;
  byte *__args;
  iterator iVar4;
  ulong uVar5;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  uVar5 = value >> 0x3f ^ value;
  if (value < 0 || 0x7f < uVar5) {
    do {
      local_2a = (byte)uVar5 | 0x80;
      iVar4._M_current =
           (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                  (buffer,iVar4,&local_2a);
      }
      else {
        *iVar4._M_current = local_2a;
        ppuVar1 = &(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppuVar1 = *ppuVar1 + 1;
      }
      uVar3 = uVar5 >> 7;
      bVar2 = 0x1fff < uVar5;
      uVar5 = uVar3;
    } while (bVar2);
    local_29 = (byte)uVar3 | (byte)((ulong)value >> 0x39) & 0xc0;
    iVar4._M_current =
         (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_29;
      goto LAB_001ccf8c;
    }
    *iVar4._M_current = local_29;
  }
  else {
    local_2b = (byte)uVar5;
    iVar4._M_current =
         (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar4._M_current ==
        (buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      __args = &local_2b;
LAB_001ccf8c:
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_realloc_insert<unsigned_char>
                (buffer,iVar4,__args);
      return;
    }
    *iVar4._M_current = local_2b;
  }
  ppuVar1 = &(buffer->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  *ppuVar1 = *ppuVar1 + 1;
  return;
}

Assistant:

void writeRawInt(std::vector<uint8_t> &buffer, int64_t value) {
	int sign = (value >= 0 ? 1 : -1);
	auto t = (sign > 0 ? static_cast<uint64_t>(value) : static_cast<uint64_t>(~value));
	if (sign > 0 && t < 128) {
		buffer.emplace_back(static_cast<uint8_t>(t));
		return;
	}
	for (;;) {
		buffer.emplace_back(static_cast<uint8_t>((t & 0x7FU) | 0x80U));
		t >>= 7U;
		if (t < 64) {
			buffer.emplace_back(static_cast<uint8_t>(t | (sign > 0 ? 0U : 0x40U)));
			break;
		}
	}
}